

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Scanner::scanDocumentIndicator(Scanner *this,bool IsStart)

{
  undefined1 local_68 [8];
  Token T;
  bool IsStart_local;
  Scanner *this_local;
  
  T.Value.field_2._M_local_buf[0xf] = IsStart;
  unrollIndent(this,-1);
  SmallVectorImpl<(anonymous_namespace)::SimpleKey>::clear
            (&(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>);
  this->IsSimpleKeyAllowed = false;
  Token::Token((Token *)local_68);
  local_68._0_4_ = TK_DocumentEnd;
  if ((T.Value.field_2._M_local_buf[0xf] & 1U) != 0) {
    local_68._0_4_ = TK_DocumentStart;
  }
  T._0_8_ = this->Current;
  T.Range.Data = (char *)0x3;
  skip(this,3);
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,(Token *)local_68);
  Token::~Token((Token *)local_68);
  return true;
}

Assistant:

bool Scanner::scanDocumentIndicator(bool IsStart) {
  unrollIndent(-1);
  SimpleKeys.clear();
  IsSimpleKeyAllowed = false;

  Token T;
  T.Kind = IsStart ? Token::TK_DocumentStart : Token::TK_DocumentEnd;
  T.Range = StringRef(Current, 3);
  skip(3);
  TokenQueue.push_back(T);
  return true;
}